

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *ppGVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  invalid_argument *piVar5;
  reference __x;
  ostream *poVar6;
  size_type sVar7;
  void *pvVar8;
  iterator iVar9;
  iterator iVar10;
  pointer pIVar11;
  pointer pMVar12;
  pointer pLVar13;
  pointer pDVar14;
  undefined4 extraout_var;
  value_type *pvVar15;
  reference pvVar16;
  Graph *pGVar17;
  reference this;
  deque<van_kampen::Node,_std::allocator<van_kampen::Node>_> *this_00;
  char *pcVar18;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  exception *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  path local_bb8;
  path local_b90;
  path local_b68;
  ofstream local_b40 [8];
  ofstream outFile_1;
  Graph *comp;
  iterator __end2;
  iterator __begin2;
  deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *__range2;
  size_t compId;
  undefined1 local_8b8 [8];
  deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> comps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  ostream local_820 [8];
  ofstream outFile;
  value_type *letter;
  size_t i;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> word;
  ofstream wordOutputFile;
  unique_ptr<van_kampen::LargeFirstAlgorithm,_std::default_delete<van_kampen::LargeFirstAlgorithm>_>
  local_3f8;
  __single_object largeFirst;
  __single_object merging;
  __single_object iterative;
  unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
  algo;
  undefined1 local_3b0 [8];
  value_type hub;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  words;
  undefined1 local_378 [12];
  undefined1 local_368 [12];
  undefined1 local_358 [8];
  string text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  istream_type local_2f0 [8];
  ifstream inputFile;
  undefined1 local_d8 [8];
  ConsoleFlags flags;
  char **argv_local;
  int argc_local;
  
  flags.outputFormatString.field_2._8_8_ = argv;
  van_kampen::ConsoleFlags::ConsoleFlags((ConsoleFlags *)local_d8,argc,argv);
  std::ifstream::ifstream(local_2f0,(string *)local_d8,_S_in);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    text.field_2._M_local_buf[0xf] = '\x01';
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_330,"cannot open \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::operator+(&local_310,&local_330,"\'");
    std::invalid_argument::invalid_argument(piVar5,(string *)&local_310);
    text.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_368,local_2f0);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_378);
  std::allocator<char>::allocator();
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_378._0_8_;
  __end._M_c = local_378._8_4_;
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_368._0_8_;
  __beg._M_c = local_368._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)local_358,__beg,__end,
             (allocator<char> *)
             ((long)&words.
                     super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&words.
                     super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  van_kampen::GroupRepresentationParser::parse
            ((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
              *)&hub.
                 super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_358);
  __x = std::
        vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ::back((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                *)&hub.
                   super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            ((vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
             local_3b0,__x);
  if ((flags.perLarge._1_1_ & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::clog,"Total relations count: ");
    sVar7 = std::
            vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
            ::size((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                    *)&hub.
                       super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar8 = (void *)std::ostream::operator<<(poVar6,sVar7);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::clog,"Hub size: ");
    sVar7 = std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::size
                      ((vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                        *)local_3b0);
    pvVar8 = (void *)std::ostream::operator<<(poVar6,sVar7);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::pop_back((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
              *)&hub.
                 super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (((byte)flags.perLarge & 1) != 0) {
    ppGVar1 = &hub.
               super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar9 = std::
            vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
            ::begin((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                     *)ppGVar1);
    iVar10 = std::
             vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ::end((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                    *)ppGVar1);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>>
              ((__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
                )iVar9._M_current,
               (__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
                )iVar10._M_current);
  }
  if ((flags.perLarge._6_1_ & 1) == 0) {
    ppGVar1 = &hub.
               super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar9 = std::
            vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
            ::begin((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                     *)ppGVar1);
    iVar10 = std::
             vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ::end((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                    *)ppGVar1);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>,main::__0>
              (iVar9._M_current,iVar10._M_current);
  }
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::push_back((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
               *)&hub.
                  super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_3b0);
  std::
  unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>>
  ::unique_ptr<std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>,void>
            ((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>>
              *)&iterative);
  if ((flags.perLarge._3_1_ & 1) == 0) {
    if ((flags.perLarge._4_1_ & 1) == 0) {
      if ((flags.perLarge._5_1_ & 1) != 0) {
        std::make_unique<van_kampen::LargeFirstAlgorithm>();
        pLVar13 = std::
                  unique_ptr<van_kampen::LargeFirstAlgorithm,_std::default_delete<van_kampen::LargeFirstAlgorithm>_>
                  ::operator->(&local_3f8);
        pLVar13->cellsLimit = flags.wordOutputFileName.field_2._8_8_;
        pLVar13 = std::
                  unique_ptr<van_kampen::LargeFirstAlgorithm,_std::default_delete<van_kampen::LargeFirstAlgorithm>_>
                  ::operator->(&local_3f8);
        pLVar13->quiet = (bool)(flags.perLarge._1_1_ & 1);
        pLVar13 = std::
                  unique_ptr<van_kampen::LargeFirstAlgorithm,_std::default_delete<van_kampen::LargeFirstAlgorithm>_>
                  ::operator->(&local_3f8);
        pLVar13->maximalSmallForOneBig = (int)flags.cellsLimit;
        pLVar13 = std::
                  unique_ptr<van_kampen::LargeFirstAlgorithm,_std::default_delete<van_kampen::LargeFirstAlgorithm>_>
                  ::release(&local_3f8);
        std::
        unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
        ::reset((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
                 *)&iterative,&pLVar13->super_DiagrammGeneratingAlgorithm);
        std::
        unique_ptr<van_kampen::LargeFirstAlgorithm,_std::default_delete<van_kampen::LargeFirstAlgorithm>_>
        ::~unique_ptr(&local_3f8);
      }
    }
    else {
      std::make_unique<van_kampen::MergingAlgorithm>();
      pMVar12 = std::
                unique_ptr<van_kampen::MergingAlgorithm,_std::default_delete<van_kampen::MergingAlgorithm>_>
                ::operator->((unique_ptr<van_kampen::MergingAlgorithm,_std::default_delete<van_kampen::MergingAlgorithm>_>
                              *)&largeFirst);
      pMVar12->limit = flags.wordOutputFileName.field_2._8_8_;
      pMVar12 = std::
                unique_ptr<van_kampen::MergingAlgorithm,_std::default_delete<van_kampen::MergingAlgorithm>_>
                ::operator->((unique_ptr<van_kampen::MergingAlgorithm,_std::default_delete<van_kampen::MergingAlgorithm>_>
                              *)&largeFirst);
      pMVar12->quiet = (bool)(flags.perLarge._1_1_ & 1);
      pMVar12 = std::
                unique_ptr<van_kampen::MergingAlgorithm,_std::default_delete<van_kampen::MergingAlgorithm>_>
                ::release((unique_ptr<van_kampen::MergingAlgorithm,_std::default_delete<van_kampen::MergingAlgorithm>_>
                           *)&largeFirst);
      std::
      unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
      ::reset((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
               *)&iterative,&pMVar12->super_DiagrammGeneratingAlgorithm);
      std::
      unique_ptr<van_kampen::MergingAlgorithm,_std::default_delete<van_kampen::MergingAlgorithm>_>::
      ~unique_ptr((unique_ptr<van_kampen::MergingAlgorithm,_std::default_delete<van_kampen::MergingAlgorithm>_>
                   *)&largeFirst);
    }
  }
  else {
    std::make_unique<van_kampen::IterativeAlgorithm>();
    pIVar11 = std::
              unique_ptr<van_kampen::IterativeAlgorithm,_std::default_delete<van_kampen::IterativeAlgorithm>_>
              ::operator->((unique_ptr<van_kampen::IterativeAlgorithm,_std::default_delete<van_kampen::IterativeAlgorithm>_>
                            *)&merging);
    pIVar11->cellsLimit = flags.wordOutputFileName.field_2._8_8_;
    pIVar11 = std::
              unique_ptr<van_kampen::IterativeAlgorithm,_std::default_delete<van_kampen::IterativeAlgorithm>_>
              ::operator->((unique_ptr<van_kampen::IterativeAlgorithm,_std::default_delete<van_kampen::IterativeAlgorithm>_>
                            *)&merging);
    pIVar11->quiet = (bool)(flags.perLarge._1_1_ & 1);
    pIVar11 = std::
              unique_ptr<van_kampen::IterativeAlgorithm,_std::default_delete<van_kampen::IterativeAlgorithm>_>
              ::release((unique_ptr<van_kampen::IterativeAlgorithm,_std::default_delete<van_kampen::IterativeAlgorithm>_>
                         *)&merging);
    std::
    unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
    ::reset((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
             *)&iterative,&pIVar11->super_DiagrammGeneratingAlgorithm);
    std::
    unique_ptr<van_kampen::IterativeAlgorithm,_std::default_delete<van_kampen::IterativeAlgorithm>_>
    ::~unique_ptr((unique_ptr<van_kampen::IterativeAlgorithm,_std::default_delete<van_kampen::IterativeAlgorithm>_>
                   *)&merging);
  }
  pDVar14 = std::
            unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
            ::operator->((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
                          *)&iterative);
  (**pDVar14->_vptr_DiagrammGeneratingAlgorithm)
            (pDVar14,&hub.
                      super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ofstream::ofstream
            (&word.
              super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (string *)(flags.outputFileName.field_2._M_local_buf + 8),_S_out);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"cannot write to file \'");
    poVar6 = std::operator<<(poVar6,(string *)(flags.outputFileName.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6,"\'");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    pDVar14 = std::
              unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
              ::operator->((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
                            *)&iterative);
    iVar4 = (*pDVar14->_vptr_DiagrammGeneratingAlgorithm[1])();
    van_kampen::Diagramm::getCircuit
              ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)&i,
               (Diagramm *)CONCAT44(extraout_var,iVar4));
    for (letter = (value_type *)0x0;
        pvVar15 = (value_type *)
                  std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::size
                            ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                              *)&i), letter < pvVar15;
        letter = (value_type *)((long)&letter->to + 1)) {
      pvVar16 = std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::
                operator[]((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                            *)&i,(size_type)letter);
      poVar6 = std::operator<<((ostream *)
                               &word.
                                super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)&pvVar16->label);
      pcVar18 = "";
      if (((pvVar16->label).reversed & 1U) != 0) {
        pcVar18 = "^(-1)";
      }
      std::operator<<(poVar6,pcVar18);
      sVar7 = std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::size
                        ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)
                         &i);
      if (letter < (value_type *)(sVar7 - 1)) {
        std::operator<<((ostream *)
                        &word.
                         super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,"*");
      }
    }
    std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::~vector
              ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)&i);
  }
  std::ofstream::~ofstream
            (&word.
              super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((flags.perLarge._7_1_ & 1) == 0) {
    std::ofstream::ofstream
              (local_820,(string *)(flags.inputFileName.field_2._M_local_buf + 8),_S_out);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      comps.super__Deque_base<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_860,"cannot write to file \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&flags.inputFileName.field_2 + 8));
      std::operator+(&local_840,&local_860,"\'");
      std::invalid_argument::invalid_argument(piVar5,(string *)&local_840);
      comps.super__Deque_base<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pDVar14 = std::
              unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
              ::operator->((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
                            *)&iterative);
    pGVar17 = van_kampen::DiagrammGeneratingAlgorithm::graph(pDVar14);
    van_kampen::Graph::printSelf(pGVar17,local_820,flags.outputFileNameWoEx.field_2._8_4_);
    std::ofstream::~ofstream(local_820);
  }
  else {
    pDVar14 = std::
              unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
              ::operator->((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
                            *)&iterative);
    pGVar17 = van_kampen::DiagrammGeneratingAlgorithm::graph(pDVar14);
    van_kampen::splitToStrongComponents<main::__1>(local_8b8,(van_kampen *)pGVar17);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&compId,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &flags.shuffleGroup,auto_format);
    std::filesystem::create_directory((path *)&compId);
    std::filesystem::__cxx11::path::~path((path *)&compId);
    __range2 = (deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)0x1;
    std::deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::begin
              ((iterator *)&__end2._M_node,
               (deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)local_8b8);
    std::deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::end
              ((iterator *)&comp,
               (deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)local_8b8);
    while (bVar3 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&comp), bVar3) {
      this = std::_Deque_iterator<van_kampen::Graph,_van_kampen::Graph_&,_van_kampen::Graph_*>::
             operator*((_Deque_iterator<van_kampen::Graph,_van_kampen::Graph_&,_van_kampen::Graph_*>
                        *)&__end2._M_node);
      this_00 = van_kampen::Graph::nodes(this);
      sVar7 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::size(this_00);
      if (1 < sVar7) {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_b90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &flags.shuffleGroup,auto_format);
        std::__cxx11::to_string((string *)&e,(unsigned_long)__range2);
        std::operator+(&local_bf8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,".");
        std::operator+(&local_bd8,&local_bf8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &flags.outputFormat);
        std::filesystem::__cxx11::path::path(&local_bb8,&local_bd8,auto_format);
        std::filesystem::__cxx11::operator/(&local_b68,&local_b90,&local_bb8);
        std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                  (local_b40,&local_b68,_S_out);
        std::filesystem::__cxx11::path::~path(&local_b68);
        std::filesystem::__cxx11::path::~path(&local_bb8);
        std::__cxx11::string::~string((string *)&local_bd8);
        std::__cxx11::string::~string((string *)&local_bf8);
        std::__cxx11::string::~string((string *)&e);
        std::filesystem::__cxx11::path::~path(&local_b90);
        van_kampen::Graph::printSelf
                  (this,(ostream *)local_b40,flags.outputFileNameWoEx.field_2._8_4_);
        __range2 = (deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)
                   ((long)&(__range2->
                           super__Deque_base<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>)
                           ._M_impl.super__Deque_impl_data._M_map + 1);
        std::ofstream::~ofstream(local_b40);
      }
      std::_Deque_iterator<van_kampen::Graph,_van_kampen::Graph_&,_van_kampen::Graph_*>::operator++
                ((_Deque_iterator<van_kampen::Graph,_van_kampen::Graph_&,_van_kampen::Graph_*> *)
                 &__end2._M_node);
    }
    std::deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::~deque
              ((deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)local_8b8);
  }
  std::
  unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
  ::~unique_ptr((unique_ptr<van_kampen::DiagrammGeneratingAlgorithm,_std::default_delete<van_kampen::DiagrammGeneratingAlgorithm>_>
                 *)&iterative);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            ((vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
             local_3b0);
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::~vector((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             *)&hub.
                super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_358);
  std::ifstream::~ifstream(local_2f0);
  van_kampen::ConsoleFlags::~ConsoleFlags((ConsoleFlags *)local_d8);
  return 0;
}

Assistant:

int main(int argc, const char **argv)
{
    using namespace van_kampen;

    try
    {
        van_kampen::ConsoleFlags flags(argc, argv);
        std::ifstream inputFile(flags.inputFileName);
        if (!inputFile.good())
        {
            throw std::invalid_argument("cannot open '" + flags.inputFileName + "'");
        }
        std::string text((std::istreambuf_iterator<char>(inputFile)),
                         std::istreambuf_iterator<char>());

        std::vector<std::vector<van_kampen::GroupElement>> words = van_kampen::GroupRepresentationParser::parse(text);
        auto hub = words.back();
        if (!flags.quiet)
        {
            std::clog << "Total relations count: " << words.size() << std::endl;
            std::clog << "Hub size: " << hub.size() << std::endl;
        }
        words.pop_back();
        if (flags.shuffleGroup)
        {
            std::random_shuffle(words.begin(), words.end());
        }
        if (!flags.notSort)
        {
            std::stable_sort(words.begin(),
                             words.end(),
                             [](const std::vector<van_kampen::GroupElement> &a, const std::vector<van_kampen::GroupElement> &b) {
                                 return a.size() < b.size();
                             });
        }
        words.push_back(hub);
        std::unique_ptr<DiagrammGeneratingAlgorithm> algo;
        if (flags.iterativeAlgo)
        {
            auto iterative = std::make_unique<IterativeAlgorithm>();
            iterative->cellsLimit = flags.cellsLimit;
            iterative->quiet = flags.quiet;
            algo.reset(iterative.release());
        }
        else if (flags.mergingAlgo)
        {
            auto merging = std::make_unique<MergingAlgorithm>();
            merging->limit = flags.cellsLimit;
            merging->quiet = flags.quiet;
            algo.reset(merging.release());
        }
        else if (flags.largeFirstAlgo)
        {
            auto largeFirst = std::make_unique<LargeFirstAlgorithm>();
            largeFirst->cellsLimit = flags.cellsLimit;
            largeFirst->quiet = flags.quiet;
            largeFirst->maximalSmallForOneBig = flags.perLarge;
            algo.reset(largeFirst.release());
        }

        algo->generate(words);

        {
            std::ofstream wordOutputFile(flags.wordOutputFileName);
            if (!wordOutputFile.good())
            {
                std::cerr << "cannot write to file '" << flags.wordOutputFileName << "'" << std::endl;
            }
            else
            {
                std::vector<van_kampen::Transition> word = algo->diagramm().getCircuit();
                for (std::size_t i = 0; i < word.size(); ++i)
                {
                    auto &letter = word[i];
                    wordOutputFile << letter.label.name << (letter.label.reversed ? "^(-1)" : "");
                    if (i < word.size() - 1)
                    {
                        wordOutputFile << "*";
                    }
                }
            }
        }


        if (!flags.split)
        {
            std::ofstream outFile(flags.outputFileName);
            if (!outFile.good())
            {
                throw std::invalid_argument("cannot write to file '" + flags.outputFileName + "'");
            }
            algo->graph().printSelf(outFile, flags.outputFormat);
        }
        else
        {
            std::deque<van_kampen::Graph> comps = splitToStrongComponents(algo->graph(), [](const Transition &tr) {
                return tr.priority >= 0.01;
            });
            std::filesystem::create_directory(flags.outputFileNameWoEx);
            std::size_t compId = 1;
            for (const van_kampen::Graph &comp : comps)
            {
                if (comp.nodes().size() < 2)
                    continue;
                std::ofstream outFile(std::filesystem::path(flags.outputFileNameWoEx) / (std::to_string(compId) + "." + flags.outputFormatString));
                comp.printSelf(outFile, flags.outputFormat);
                ++compId;
            }
        }
    }
    catch (const std::exception &e)
    {
        std::cerr << e.what() << '\n';
        return 0;
    }
}